

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O3

int main(void)

{
  int iVar1;
  int iVar2;
  time_t tVar3;
  
  plan(2);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","main");
  tVar3 = time((time_t *)0x0);
  seed = (uint)tVar3;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"random seed is %u",(ulong)seed);
  fputc(10,_stdout);
  srand(seed);
  iVar1 = rand();
  iVar2 = 8;
  if (8 < iVar1 % 0x1000) {
    iVar2 = iVar1 % 0x1000;
  }
  objsize = iVar2 + 7U & 0x7ffffff8;
  quota.value = 0x40000000000000;
  slab_arena_create(&arena,&quota,0,4000000,2);
  slab_cache_create(&cache,&arena);
  mempool_basic();
  mempool_align();
  slab_cache_destroy(&cache);
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","main");
  iVar2 = check_plan();
  return iVar2;
}

Assistant:

int main()
{
#ifdef ENABLE_ASAN
	plan(3);
#else
	plan(2);
#endif
	header();

	seed = time(NULL);
	note("random seed is %u", seed);
	srand(seed);

	objsize = rand() % OBJSIZE_MAX;
	if (objsize < OBJSIZE_MIN)
		objsize = OBJSIZE_MIN;
	/*
	 * Mempool does not work with not aligned sizes. Because
	 * it utilizes the unused blocks for storing internal
	 * info, which needs alignment.
	 */
	objsize = small_align(objsize, alignof(uint64_t));

	quota_init(&quota, UINT_MAX);

	slab_arena_create(&arena, &quota, 0,
			  4000000, MAP_PRIVATE);
	slab_cache_create(&cache, &arena);

	mempool_basic();
	mempool_align();
#ifdef ENABLE_ASAN
	mempool_membership();
#endif

	slab_cache_destroy(&cache);

	footer();
	return check_plan();
}